

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_string_utils.cpp
# Opt level: O2

void strsplit(string *str,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *ret,string *sep)

{
  long lVar1;
  string tmp;
  string local_50 [32];
  
  if (str->_M_string_length != 0) {
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = '\0';
    lVar1 = std::__cxx11::string::find_first_not_of((string *)str,(ulong)sep);
    while (lVar1 != -1) {
      lVar1 = std::__cxx11::string::find((string *)str,(ulong)sep);
      if (lVar1 == -1) {
        lVar1 = -1;
        std::__cxx11::string::substr((ulong)local_50,(ulong)str);
        std::__cxx11::string::operator=((string *)&tmp,local_50);
        std::__cxx11::string::~string(local_50);
      }
      else {
        std::__cxx11::string::substr((ulong)local_50,(ulong)str);
        std::__cxx11::string::operator=((string *)&tmp,local_50);
        std::__cxx11::string::~string(local_50);
        lVar1 = lVar1 + sep->_M_string_length;
      }
      if (tmp._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(ret,&tmp);
        tmp._M_string_length = 0;
        *tmp._M_dataplus._M_p = '\0';
      }
    }
    std::__cxx11::string::~string((string *)&tmp);
  }
  return;
}

Assistant:

void strsplit(const std::string& str, std::vector<std::string>& ret, std::string sep)
{
  if (str.empty())
    return;

  std::string tmp;  
  std::string::size_type pos_begin = str.find_first_not_of(sep);  
  std::string::size_type comma_pos = 0;  

  while (pos_begin != std::string::npos) {
    comma_pos = str.find(sep, pos_begin);  
    if (comma_pos != std::string::npos) {
      tmp = str.substr(pos_begin, comma_pos - pos_begin);
      pos_begin = comma_pos + sep.length();
    }
    else {
      tmp = str.substr(pos_begin);
      pos_begin = comma_pos;
    }
    if (!tmp.empty()) {
      ret.push_back(tmp);
      tmp.clear();
    }
  }
}